

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kd_tree_builder.hpp
# Opt level: O0

void __thiscall
pico_tree::internal::
build_kd_tree_impl<pico_tree::internal::space_wrapper<std::vector<std::array<float,784ul>,std::allocator<std::array<float,784ul>>>>,pico_tree::max_leaf_size_t,pico_tree::sliding_midpoint_max_side_t,pico_tree::internal::kd_tree_data<pico_tree::internal::kd_tree_node_euclidean<int,float>,784ul>>
::compute_bounding_box<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
          (build_kd_tree_impl<pico_tree::internal::space_wrapper<std::vector<std::array<float,_784UL>,_std::allocator<std::array<float,_784UL>_>_>_>,_pico_tree::max_leaf_size_t,_pico_tree::sliding_midpoint_max_side_t,_pico_tree::internal::kd_tree_data<pico_tree::internal::kd_tree_node_euclidean<int,_float>,_784UL>_>
           *this,__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> begin,
          __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> end,box_type *box)

{
  bool bVar1;
  box_base<pico_tree::internal::box<float,_784UL>_> *in_RCX;
  box_base<pico_tree::internal::box<float,_784UL>_> *in_RDX;
  scalar_type *in_RDI;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *in_stack_ffffffffffffffc8;
  box_base<pico_tree::internal::box<float,_784UL>_> *in_stack_ffffffffffffffd0;
  scalar_type *x;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> local_8;
  
  x = in_RDI;
  box_base<pico_tree::internal::box<float,_784UL>_>::fill_inverse_max(in_RCX);
  while( true ) {
    bVar1 = __gnu_cxx::operator<
                      ((__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)
                       in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
    in_stack_ffffffffffffffd0 = in_RCX;
    if (!bVar1) break;
    in_stack_ffffffffffffffc8 =
         *(__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> **)in_RDI;
    in_RCX = in_stack_ffffffffffffffd0;
    __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator*
              (&local_8);
    space_wrapper<std::vector<std::array<float,_784UL>,_std::allocator<std::array<float,_784UL>_>_>_>
    ::operator[]<int>((space_wrapper<std::vector<std::array<float,_784UL>,_std::allocator<std::array<float,_784UL>_>_>_>
                       *)in_stack_ffffffffffffffd0,(int)((ulong)in_stack_ffffffffffffffc8 >> 0x20));
    box_base<pico_tree::internal::box<float,_784UL>_>::fit(in_RDX,x);
    __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator++
              (&local_8);
  }
  return;
}

Assistant:

inline void compute_bounding_box(
      RandomAccessIterator_ begin,
      RandomAccessIterator_ end,
      box_type& box) const {
    box.fill_inverse_max();
    for (; begin < end; ++begin) {
      box.fit(space_[*begin]);
    }
  }